

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void get_range<double,unsigned_long>
               (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  ulong uVar1;
  bool bVar2;
  unsigned_long ix;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  uVar3 = Xc_indptr[col_num];
  uVar1 = Xc_indptr[col_num + 1];
  if (uVar1 - uVar3 < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
    dVar4 = 0.0;
    dVar7 = 0.0;
  }
  else {
    dVar7 = INFINITY;
    dVar4 = -INFINITY;
  }
  if (missing_action == Fail) {
    dVar5 = dVar4;
    dVar6 = dVar7;
    if (uVar3 < uVar1) {
      do {
        dVar4 = Xc[uVar3];
        dVar7 = dVar4;
        if (dVar6 <= dVar4) {
          dVar7 = dVar6;
        }
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
        uVar3 = uVar3 + 1;
        dVar5 = dVar4;
        dVar6 = dVar7;
      } while (uVar1 != uVar3);
      *xmin = dVar7;
      *xmax = dVar4;
    }
  }
  else if (uVar3 < uVar1) {
    do {
      dVar5 = Xc[uVar3];
      if (ABS(dVar5) != INFINITY) {
        dVar6 = dVar5;
        if (dVar7 <= dVar5) {
          dVar6 = dVar7;
        }
        dVar7 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar6 | -(ulong)NAN(dVar7) & (ulong)dVar5);
        *xmin = dVar7;
        dVar6 = dVar5;
        if (dVar5 <= dVar4) {
          dVar6 = dVar4;
        }
        dVar4 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar6 | -(ulong)NAN(dVar4) & (ulong)dVar5);
        *xmax = dVar4;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  bVar2 = true;
  if (((dVar7 != dVar4) || (NAN(dVar7) || NAN(dVar4))) && (dVar4 != -INFINITY || dVar7 != INFINITY))
  {
    bVar2 = NAN(dVar4);
  }
  *unsplittable = bVar2;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}